

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1866ed::syslog_logger::syslog_logger
          (syslog_logger *this,string *ident,int facility)

{
  size_type sVar1;
  pointer pvVar2;
  char *__src;
  reference pvVar3;
  array<char,_50UL> *this_00;
  size_type size;
  int facility_local;
  string *ident_local;
  syslog_logger *this_local;
  
  pstore::logger::logger(&this->super_logger);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__syslog_logger_00244bb8;
  *(int *)&(this->super_logger).field_0x2c = facility;
  this_00 = &this->ident_;
  (this->ident_)._M_elems[0x20] = '\0';
  (this->ident_)._M_elems[0x21] = '\0';
  (this->ident_)._M_elems[0x22] = '\0';
  (this->ident_)._M_elems[0x23] = '\0';
  (this->ident_)._M_elems[0x24] = '\0';
  (this->ident_)._M_elems[0x25] = '\0';
  (this->ident_)._M_elems[0x26] = '\0';
  (this->ident_)._M_elems[0x27] = '\0';
  (this->ident_)._M_elems[0x28] = '\0';
  (this->ident_)._M_elems[0x29] = '\0';
  (this->ident_)._M_elems[0x2a] = '\0';
  (this->ident_)._M_elems[0x2b] = '\0';
  (this->ident_)._M_elems[0x2c] = '\0';
  (this->ident_)._M_elems[0x2d] = '\0';
  (this->ident_)._M_elems[0x2e] = '\0';
  (this->ident_)._M_elems[0x2f] = '\0';
  (this->ident_)._M_elems[0x10] = '\0';
  (this->ident_)._M_elems[0x11] = '\0';
  (this->ident_)._M_elems[0x12] = '\0';
  (this->ident_)._M_elems[0x13] = '\0';
  (this->ident_)._M_elems[0x14] = '\0';
  (this->ident_)._M_elems[0x15] = '\0';
  (this->ident_)._M_elems[0x16] = '\0';
  (this->ident_)._M_elems[0x17] = '\0';
  (this->ident_)._M_elems[0x18] = '\0';
  (this->ident_)._M_elems[0x19] = '\0';
  (this->ident_)._M_elems[0x1a] = '\0';
  (this->ident_)._M_elems[0x1b] = '\0';
  (this->ident_)._M_elems[0x1c] = '\0';
  (this->ident_)._M_elems[0x1d] = '\0';
  (this->ident_)._M_elems[0x1e] = '\0';
  (this->ident_)._M_elems[0x1f] = '\0';
  (this->ident_)._M_elems[0] = '\0';
  (this->ident_)._M_elems[1] = '\0';
  (this->ident_)._M_elems[2] = '\0';
  (this->ident_)._M_elems[3] = '\0';
  (this->ident_)._M_elems[4] = '\0';
  (this->ident_)._M_elems[5] = '\0';
  (this->ident_)._M_elems[6] = '\0';
  (this->ident_)._M_elems[7] = '\0';
  (this->ident_)._M_elems[8] = '\0';
  (this->ident_)._M_elems[9] = '\0';
  (this->ident_)._M_elems[10] = '\0';
  (this->ident_)._M_elems[0xb] = '\0';
  (this->ident_)._M_elems[0xc] = '\0';
  (this->ident_)._M_elems[0xd] = '\0';
  (this->ident_)._M_elems[0xe] = '\0';
  (this->ident_)._M_elems[0xf] = '\0';
  (this->ident_)._M_elems[0x30] = '\0';
  (this->ident_)._M_elems[0x31] = '\0';
  sVar1 = std::array<char,_50UL>::size(this_00);
  pvVar2 = std::array<char,_50UL>::data(this_00);
  __src = (char *)std::__cxx11::string::c_str();
  strncpy(pvVar2,__src,sVar1 - 1);
  pvVar3 = std::array<char,_50UL>::operator[](this_00,sVar1 - 1);
  *pvVar3 = '\0';
  pvVar2 = std::array<char,_50UL>::data(this_00);
  openlog(pvVar2,1,*(int *)&(this->super_logger).field_0x2c);
  return;
}

Assistant:

syslog_logger::syslog_logger (std::string const & ident, int const facility)
            : facility_{facility} {

        auto const size = ident_.size () - 1U;
        std::strncpy (ident_.data (), ident.c_str (), size);
        ident_[size] = '\0';

        openlog (ident_.data (), LOG_PID, facility_);
    }